

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall
sf::priv::GlxContext::updateSettingsFromVisualInfo(GlxContext *this,XVisualInfo *visualInfo)

{
  undefined8 in_RSI;
  long in_RDI;
  int sRgb;
  int samples;
  int multiSampling;
  int stencil;
  int depth;
  undefined4 local_34;
  int local_24;
  undefined4 local_20;
  int local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  glXGetConfig(*(undefined8 *)(in_RDI + 0x30),in_RSI,0xc,&local_14);
  glXGetConfig(*(undefined8 *)(in_RDI + 0x30),local_10,0xd,&local_18);
  if (sfglx_ext_ARB_multisample == 1) {
    glXGetConfig(*(undefined8 *)(in_RDI + 0x30),local_10,100000,&local_1c);
    glXGetConfig(*(undefined8 *)(in_RDI + 0x30),local_10,0x186a1,&local_20);
  }
  else {
    local_1c = 0;
    local_20 = 0;
  }
  if ((sfglx_ext_EXT_framebuffer_sRGB == 1) || (sfglx_ext_ARB_framebuffer_sRGB == 1)) {
    glXGetConfig(*(undefined8 *)(in_RDI + 0x30),local_10,0x20b2,&local_24);
  }
  else {
    local_24 = 0;
  }
  *(undefined4 *)(in_RDI + 8) = local_14;
  *(undefined4 *)(in_RDI + 0xc) = local_18;
  if (local_1c == 0) {
    local_34 = 0;
  }
  else {
    local_34 = local_20;
  }
  *(undefined4 *)(in_RDI + 0x10) = local_34;
  *(bool *)(in_RDI + 0x20) = local_24 == 1;
  return;
}

Assistant:

void GlxContext::updateSettingsFromVisualInfo(XVisualInfo* visualInfo)
{
    // Update the creation settings from the chosen format
    int depth, stencil, multiSampling, samples, sRgb;
    glXGetConfig(m_display, visualInfo, GLX_DEPTH_SIZE,   &depth);
    glXGetConfig(m_display, visualInfo, GLX_STENCIL_SIZE, &stencil);

    if (sfglx_ext_ARB_multisample == sfglx_LOAD_SUCCEEDED)
    {
        glXGetConfig(m_display, visualInfo, GLX_SAMPLE_BUFFERS_ARB, &multiSampling);
        glXGetConfig(m_display, visualInfo, GLX_SAMPLES_ARB,        &samples);
    }
    else
    {
        multiSampling = 0;
        samples = 0;
    }

    if ((sfglx_ext_EXT_framebuffer_sRGB == sfglx_LOAD_SUCCEEDED) || (sfglx_ext_ARB_framebuffer_sRGB == sfglx_LOAD_SUCCEEDED))
    {
        glXGetConfig(m_display, visualInfo, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &sRgb);
    }
    else
    {
        sRgb = 0;
    }

    m_settings.depthBits         = static_cast<unsigned int>(depth);
    m_settings.stencilBits       = static_cast<unsigned int>(stencil);
    m_settings.antialiasingLevel = multiSampling ? samples : 0;
    m_settings.sRgbCapable       = (sRgb == True);
}